

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_chatwindow.cpp
# Opt level: O2

void ChatWindow::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 *puVar1;
  
  if (_c != RegisterMethodArgumentMetaType) {
    if (_c == InvokeMetaMethod) {
      switch(_id) {
      case 0:
        attemptConnection((ChatWindow *)_o);
        return;
      case 1:
        connectedToServer((ChatWindow *)_o);
        return;
      case 2:
        attemptLogin((ChatWindow *)_o,(QString *)_a[1]);
        return;
      case 3:
        loggedIn((ChatWindow *)_o);
        return;
      case 4:
        loginFailed((ChatWindow *)_o,(QString *)_a[1]);
        return;
      case 5:
        messageReceived((ChatWindow *)_o,(QString *)_a[1],(QString *)_a[2]);
        return;
      case 6:
        sendMessage((ChatWindow *)_o);
        return;
      case 7:
        disconnectedFromServer((ChatWindow *)_o);
        return;
      case 8:
        userJoined((ChatWindow *)_o,(QString *)_a[1]);
        return;
      case 9:
        userLeft((ChatWindow *)_o,(QString *)_a[1]);
        return;
      case 10:
        error((ChatWindow *)_o,*_a[1]);
        return;
      }
    }
    return;
  }
  if (_id == 10) {
    puVar1 = (undefined8 *)*_a;
    if (*_a[1] == 0) {
      *puVar1 = &QtPrivate::QMetaTypeInterfaceWrapper<QAbstractSocket::SocketError>::metaType;
      return;
    }
  }
  else {
    puVar1 = (undefined8 *)*_a;
  }
  *puVar1 = 0;
  return;
}

Assistant:

void ChatWindow::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<ChatWindow *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->attemptConnection(); break;
        case 1: _t->connectedToServer(); break;
        case 2: _t->attemptLogin((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 3: _t->loggedIn(); break;
        case 4: _t->loginFailed((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 5: _t->messageReceived((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 6: _t->sendMessage(); break;
        case 7: _t->disconnectedFromServer(); break;
        case 8: _t->userJoined((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 9: _t->userLeft((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 10: _t->error((*reinterpret_cast< std::add_pointer_t<QAbstractSocket::SocketError>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 10:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAbstractSocket::SocketError >(); break;
            }
            break;
        }
    }
}